

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void ConstructDefaultFilename(path *dest,char *ext,bool checkIfDestIsEmpty)

{
  char *pcVar1;
  bool bVar2;
  path local_68;
  reference local_40;
  SSource *src;
  iterator __end1;
  iterator __begin1;
  vector<SSource,_std::allocator<SSource>_> *__range1;
  char *pcStack_18;
  bool checkIfDestIsEmpty_local;
  char *ext_local;
  path *dest_local;
  
  pcStack_18 = ext;
  ext_local = (char *)dest;
  if ((ext == (char *)0x0) || (*ext == '\0')) {
    exit(1);
  }
  if ((!checkIfDestIsEmpty) || (bVar2 = std::filesystem::__cxx11::path::empty(dest), bVar2)) {
    std::filesystem::__cxx11::path::operator=((path *)ext_local,(char (*) [4])"asm");
    __end1 = std::vector<SSource,_std::allocator<SSource>_>::begin(&sourceFiles);
    src = (SSource *)std::vector<SSource,_std::allocator<SSource>_>::end(&sourceFiles);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<SSource_*,_std::vector<SSource,_std::allocator<SSource>_>_>
                                       *)&src), bVar2) {
      local_40 = __gnu_cxx::
                 __normal_iterator<SSource_*,_std::vector<SSource,_std::allocator<SSource>_>_>::
                 operator*(&__end1);
      if (local_40->fname[0] != '\0') {
        std::filesystem::__cxx11::path::operator=((path *)ext_local,local_40->fname);
        break;
      }
      __gnu_cxx::__normal_iterator<SSource_*,_std::vector<SSource,_std::allocator<SSource>_>_>::
      operator++(&__end1);
    }
    pcVar1 = ext_local;
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_68,&stack0xffffffffffffffe8,auto_format);
    std::filesystem::__cxx11::path::replace_extension((path *)pcVar1);
    std::filesystem::__cxx11::path::~path(&local_68);
  }
  return;
}

Assistant:

void ConstructDefaultFilename(std::filesystem::path & dest, const char* ext, bool checkIfDestIsEmpty) {
	if (nullptr == ext || !ext[0]) exit(1);	// invalid arguments
	// if the destination buffer has already some content and check is requested, exit
	if (checkIfDestIsEmpty && !dest.empty()) return;
	// construct the new default name - search for explicit name in sourcefiles
	dest = "asm";		// use "asm" base if no explicit filename available
	for (const SSource & src : sourceFiles) {
		if (!src.fname[0]) continue;
		dest = src.fname;
		break;
	}
	dest.replace_extension(ext);
}